

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# stb_image.cpp
# Opt level: O1

int stbi__do_zlib(stbi__zbuf *a,char *obuf,int olen,int exp,int parse_header)

{
  ushort uVar1;
  stbi_uc *psVar2;
  bool bVar3;
  int iVar4;
  char *pcVar5;
  byte bVar6;
  ushort uVar7;
  uint uVar8;
  uint uVar9;
  int iVar10;
  uint uVar11;
  uint uVar12;
  byte *pbVar13;
  byte *pbVar14;
  long lVar15;
  stbi_uc *psVar16;
  stbi_uc sVar17;
  uint uVar18;
  uint uVar19;
  long lVar20;
  ulong uVar21;
  stbi__uint32 sVar22;
  int iVar23;
  uint uVar24;
  int iVar25;
  ulong unaff_R15;
  long in_FS_OFFSET;
  stbi_uc lencodes [455];
  stbi__zhuffman z_codelength;
  undefined8 local_a08;
  undefined7 uStack_a00;
  undefined4 uStack_9f9;
  byte abStack_9e9 [258];
  stbi_uc asStack_8e7 [211];
  stbi__zhuffman local_814;
  
  a->zout_start = obuf;
  a->zout = obuf;
  a->zout_end = obuf + olen;
  a->z_expandable = exp;
  if (parse_header == 0) {
LAB_00142ca9:
    a->num_bits = 0;
    a->code_buffer = 0;
    do {
      if (a->num_bits < 1) {
        uVar18 = a->code_buffer;
        pbVar13 = a->zbuffer;
        iVar10 = a->num_bits;
        do {
          uVar8 = 0;
          pbVar14 = pbVar13;
          if (pbVar13 < a->zbuffer_end) {
            pbVar14 = pbVar13 + 1;
            a->zbuffer = pbVar14;
            uVar8 = (uint)*pbVar13;
          }
          uVar18 = uVar18 | uVar8 << ((byte)iVar10 & 0x1f);
          a->code_buffer = uVar18;
          a->num_bits = iVar10 + 8;
          bVar3 = iVar10 < 0x11;
          pbVar13 = pbVar14;
          iVar10 = iVar10 + 8;
        } while (bVar3);
      }
      iVar4 = a->num_bits;
      uVar18 = a->code_buffer;
      uVar8 = uVar18 >> 1;
      a->code_buffer = uVar8;
      iVar10 = iVar4 + -1;
      a->num_bits = iVar10;
      if (iVar4 < 3) {
        pbVar13 = a->zbuffer;
        do {
          uVar9 = 0;
          pbVar14 = pbVar13;
          if (pbVar13 < a->zbuffer_end) {
            pbVar14 = pbVar13 + 1;
            a->zbuffer = pbVar14;
            uVar9 = (uint)*pbVar13;
          }
          uVar8 = uVar8 | uVar9 << ((byte)iVar10 & 0x1f);
          a->code_buffer = uVar8;
          a->num_bits = iVar10 + 8;
          bVar3 = iVar10 < 0x11;
          pbVar13 = pbVar14;
          iVar10 = iVar10 + 8;
        } while (bVar3);
      }
      iVar10 = a->num_bits;
      uVar8 = a->code_buffer;
      uVar11 = uVar8 >> 2;
      a->code_buffer = uVar11;
      uVar9 = iVar10 - 2;
      a->num_bits = uVar9;
      switch(uVar8 & 3) {
      case 0:
        uVar8 = uVar9 & 7;
        if (uVar8 != 0) {
          if (iVar10 < 2) {
            pbVar13 = a->zbuffer;
            do {
              uVar24 = 0;
              pbVar14 = pbVar13;
              if (pbVar13 < a->zbuffer_end) {
                pbVar14 = pbVar13 + 1;
                a->zbuffer = pbVar14;
                uVar24 = (uint)*pbVar13;
              }
              uVar11 = uVar11 | uVar24 << ((byte)uVar9 & 0x1f);
              a->code_buffer = uVar11;
              a->num_bits = uVar9 + 8;
              bVar3 = (int)uVar9 < 0x11;
              pbVar13 = pbVar14;
              uVar9 = uVar9 + 8;
            } while (bVar3);
          }
          a->code_buffer = a->code_buffer >> (sbyte)uVar8;
          a->num_bits = a->num_bits - uVar8;
        }
        if (a->num_bits < 1) {
          uVar21 = 0;
        }
        else {
          uVar8 = a->code_buffer;
          uVar21 = 0;
          iVar10 = a->num_bits;
          do {
            *(char *)((long)local_814.fast + uVar21) = (char)uVar8;
            uVar21 = uVar21 + 1;
            uVar8 = uVar8 >> 8;
            iVar4 = iVar10 + -8;
            bVar3 = 8 < iVar10;
            iVar10 = iVar4;
          } while (bVar3);
          a->code_buffer = uVar8;
          a->num_bits = iVar4;
        }
        if ((uint)uVar21 < 4) {
          psVar16 = a->zbuffer;
          psVar2 = a->zbuffer_end;
          uVar21 = uVar21 & 0xffffffff;
          do {
            if (psVar16 < psVar2) {
              a->zbuffer = psVar16 + 1;
              sVar17 = *psVar16;
              psVar16 = psVar16 + 1;
            }
            else {
              sVar17 = '\0';
            }
            *(stbi_uc *)((long)local_814.fast + uVar21) = sVar17;
            uVar21 = uVar21 + 1;
          } while (uVar21 != 4);
        }
        if ((local_814.fast[1] ^ local_814.fast[0]) == 0xffff) {
          unaff_R15 = (ulong)local_814.fast[0];
          if (a->zbuffer + unaff_R15 <= a->zbuffer_end) {
            if ((a->zout + unaff_R15 <= a->zout_end) ||
               (iVar10 = stbi__zexpand(a,a->zout,(uint)local_814.fast[0]), iVar10 != 0)) {
              memcpy(a->zout,a->zbuffer,unaff_R15);
              a->zbuffer = a->zbuffer + unaff_R15;
              a->zout = a->zout + unaff_R15;
              goto LAB_001437e5;
            }
            goto switchD_00142d74_caseD_3;
          }
          pcVar5 = "read past buffer";
        }
        else {
          pcVar5 = "zlib corrupt";
        }
        goto LAB_00143822;
      case 1:
        iVar10 = stbi__zbuild_huffman
                           (&a->z_length,
                            "\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\t\t\t\t\t\t\t\t\t\t\t\t\t\t\t\t\t\t\t\t\t\t\t\t\t\t\t\t\t\t\t\t\t\t\t\t\t\t\t\t\t\t\t\t\t\t\t\t\t\t\t\t\t\t\t\t\t\t\t\t\t\t\t\t\t\t\t\t\t\t\t\t\t\t\t\t\t\t\t\t\t\t\t\t\t\t\t\t\t\t\t\t\t\t\t\t\t\t\t\t\t\t\t\t\t\t\t\t\t\t\t\t\a\a\a\a\a\a\a\a\a\a\a\a\a\a\a\a\a\a\a\a\a\a\a\a\b\b\b\b\b\b\b\b"
                            ,0x120);
        if (iVar10 == 0) goto switchD_00142d74_caseD_3;
        iVar10 = stbi__zbuild_huffman
                           (&a->z_distance,
                            "\x05\x05\x05\x05\x05\x05\x05\x05\x05\x05\x05\x05\x05\x05\x05\x05\x05\x05\x05\x05\x05\x05\x05\x05\x05\x05\x05\x05\x05\x05\x05\x05"
                            ,0x20);
        break;
      case 2:
        if (iVar10 < 7) {
          pbVar13 = a->zbuffer;
          do {
            uVar8 = 0;
            pbVar14 = pbVar13;
            if (pbVar13 < a->zbuffer_end) {
              pbVar14 = pbVar13 + 1;
              a->zbuffer = pbVar14;
              uVar8 = (uint)*pbVar13;
            }
            uVar11 = uVar11 | uVar8 << ((byte)uVar9 & 0x1f);
            a->code_buffer = uVar11;
            a->num_bits = uVar9 + 8;
            bVar3 = (int)uVar9 < 0x11;
            pbVar13 = pbVar14;
            uVar9 = uVar9 + 8;
          } while (bVar3);
        }
        iVar4 = a->num_bits;
        uVar8 = a->code_buffer;
        uVar9 = uVar8 >> 5;
        a->code_buffer = uVar9;
        iVar10 = iVar4 + -5;
        a->num_bits = iVar10;
        if (iVar4 < 10) {
          pbVar13 = a->zbuffer;
          do {
            uVar11 = 0;
            pbVar14 = pbVar13;
            if (pbVar13 < a->zbuffer_end) {
              pbVar14 = pbVar13 + 1;
              a->zbuffer = pbVar14;
              uVar11 = (uint)*pbVar13;
            }
            uVar9 = uVar9 | uVar11 << ((byte)iVar10 & 0x1f);
            a->code_buffer = uVar9;
            a->num_bits = iVar10 + 8;
            bVar3 = iVar10 < 0x11;
            pbVar13 = pbVar14;
            iVar10 = iVar10 + 8;
          } while (bVar3);
        }
        iVar4 = a->num_bits;
        uVar9 = a->code_buffer;
        uVar11 = uVar9 >> 5;
        a->code_buffer = uVar11;
        iVar10 = iVar4 + -5;
        a->num_bits = iVar10;
        if (iVar4 < 9) {
          pbVar13 = a->zbuffer;
          do {
            uVar24 = 0;
            pbVar14 = pbVar13;
            if (pbVar13 < a->zbuffer_end) {
              pbVar14 = pbVar13 + 1;
              a->zbuffer = pbVar14;
              uVar24 = (uint)*pbVar13;
            }
            uVar11 = uVar11 | uVar24 << ((byte)iVar10 & 0x1f);
            a->code_buffer = uVar11;
            a->num_bits = iVar10 + 8;
            bVar3 = iVar10 < 0x11;
            pbVar13 = pbVar14;
            iVar10 = iVar10 + 8;
          } while (bVar3);
        }
        uVar8 = uVar8 & 0x1f;
        iVar4 = uVar8 + 0x101;
        uVar24 = (uVar9 & 0x1f) + 1;
        unaff_R15 = (ulong)uVar24;
        uVar9 = a->code_buffer;
        uVar11 = uVar9 >> 4;
        a->code_buffer = uVar11;
        iVar10 = a->num_bits + -4;
        a->num_bits = iVar10;
        local_a08 = 0;
        uStack_a00 = 0;
        uStack_9f9 = 0;
        lVar20 = 0;
        do {
          uVar12 = uVar11;
          if (iVar10 < 3) {
            pbVar13 = a->zbuffer;
            iVar23 = iVar10;
            do {
              uVar11 = 0;
              pbVar14 = pbVar13;
              if (pbVar13 < a->zbuffer_end) {
                pbVar14 = pbVar13 + 1;
                a->zbuffer = pbVar14;
                uVar11 = (uint)*pbVar13;
              }
              uVar12 = uVar12 | uVar11 << ((byte)iVar23 & 0x1f);
              a->code_buffer = uVar12;
              iVar10 = iVar23 + 8;
              a->num_bits = iVar10;
              bVar3 = iVar23 < 0x11;
              pbVar13 = pbVar14;
              iVar23 = iVar10;
            } while (bVar3);
          }
          uVar11 = uVar12 >> 3;
          a->code_buffer = uVar11;
          iVar10 = iVar10 + -3;
          a->num_bits = iVar10;
          *(byte *)((long)&local_a08 +
                   (ulong)(byte)(&stbi__compute_huffman_codes(stbi__zbuf*)::length_dezigzag)[lVar20]
                   ) = (byte)uVar12 & 7;
          lVar20 = lVar20 + 1;
        } while (lVar20 != (ulong)(uVar9 & 0xf) + 4);
        iVar10 = stbi__zbuild_huffman(&local_814,(stbi_uc *)&local_a08,0x13);
        if (iVar10 == 0) goto switchD_00142d74_caseD_3;
        iVar23 = uVar24 + iVar4;
        uVar9 = a->num_bits;
        uVar11 = a->code_buffer;
        iVar10 = 0;
        while( true ) {
          if (iVar23 <= iVar10) break;
          if ((int)uVar9 < 0x10) {
            pbVar13 = a->zbuffer;
            uVar12 = uVar9;
            do {
              uVar9 = 0;
              pbVar14 = pbVar13;
              if (pbVar13 < a->zbuffer_end) {
                pbVar14 = pbVar13 + 1;
                a->zbuffer = pbVar14;
                uVar9 = (uint)*pbVar13;
              }
              uVar11 = uVar11 | uVar9 << ((byte)uVar12 & 0x1f);
              a->code_buffer = uVar11;
              uVar9 = uVar12 + 8;
              a->num_bits = uVar9;
              bVar3 = (int)uVar12 < 0x11;
              pbVar13 = pbVar14;
              uVar12 = uVar9;
            } while (bVar3);
          }
          unaff_R15 = (ulong)uVar9;
          uVar7 = local_814.fast[uVar11 & 0x1ff];
          if (uVar7 == 0) {
            uVar7 = (ushort)uVar11 << 8 | (ushort)uVar11 >> 8;
            uVar12 = (uVar7 & 0xf0f) << 4 | uVar7 >> 4 & 0xf0f;
            uVar12 = (uVar12 >> 2 & 0x3333) + (uVar12 & 0x3333) * 4;
            uVar12 = (uVar12 >> 1 & 0x5555) + (uVar12 & 0x5555) * 2;
            lVar20 = 0;
            do {
              lVar15 = lVar20;
              lVar20 = lVar15 + 1;
            } while (local_814.maxcode[lVar15 + 10] <= (int)uVar12);
            uVar19 = 0xffffffff;
            if (lVar20 != 7) {
              uVar7 = local_814.firstcode[lVar15 + 10];
              uVar1 = local_814.firstsymbol[lVar15 + 10];
              uVar11 = uVar11 >> ((char)lVar15 + 10U & 0x1f);
              a->code_buffer = uVar11;
              uVar9 = (uVar9 - (int)lVar20) - 9;
              unaff_R15 = (ulong)uVar9;
              a->num_bits = uVar9;
              uVar19 = (uint)*(ushort *)
                              ((long)&local_814 +
                              ((ulong)uVar1 +
                              ((ulong)(uVar12 >> (7U - (char)lVar20 & 0x1f)) - (ulong)uVar7)) * 2 +
                              0x5a4);
            }
          }
          else {
            uVar11 = uVar11 >> ((byte)(uVar7 >> 9) & 0x1f);
            a->code_buffer = uVar11;
            uVar9 = uVar9 - (uVar7 >> 9);
            unaff_R15 = (ulong)uVar9;
            a->num_bits = uVar9;
            uVar19 = uVar7 & 0x1ff;
          }
          if (uVar19 < 0x13) {
            if ((int)uVar19 < 0x10) {
              lVar20 = (long)iVar10;
              iVar10 = iVar10 + 1;
              abStack_9e9[lVar20 + 1] = (char)uVar19;
              bVar3 = true;
            }
            else {
              uVar9 = (uint)unaff_R15;
              if (uVar19 == 0x11) {
                if ((int)uVar9 < 3) {
                  pbVar13 = a->zbuffer;
                  do {
                    uVar9 = 0;
                    pbVar14 = pbVar13;
                    if (pbVar13 < a->zbuffer_end) {
                      pbVar14 = pbVar13 + 1;
                      a->zbuffer = pbVar14;
                      uVar9 = (uint)*pbVar13;
                    }
                    iVar25 = (int)unaff_R15;
                    uVar11 = uVar11 | uVar9 << ((byte)unaff_R15 & 0x1f);
                    a->code_buffer = uVar11;
                    uVar9 = iVar25 + 8;
                    a->num_bits = uVar9;
                    unaff_R15 = (ulong)uVar9;
                    pbVar13 = pbVar14;
                  } while (iVar25 < 0x11);
                }
                uVar19 = uVar11 >> 3;
                a->code_buffer = uVar19;
                uVar9 = uVar9 - 3;
                a->num_bits = uVar9;
                uVar12 = (uVar11 & 7) + 3;
LAB_0014327e:
                unaff_R15 = (ulong)uVar9;
                bVar6 = 0;
              }
              else {
                if (uVar19 != 0x10) {
                  if ((int)uVar9 < 7) {
                    pbVar13 = a->zbuffer;
                    do {
                      uVar9 = 0;
                      pbVar14 = pbVar13;
                      if (pbVar13 < a->zbuffer_end) {
                        pbVar14 = pbVar13 + 1;
                        a->zbuffer = pbVar14;
                        uVar9 = (uint)*pbVar13;
                      }
                      iVar25 = (int)unaff_R15;
                      uVar11 = uVar11 | uVar9 << ((byte)unaff_R15 & 0x1f);
                      a->code_buffer = uVar11;
                      uVar9 = iVar25 + 8;
                      a->num_bits = uVar9;
                      unaff_R15 = (ulong)uVar9;
                      pbVar13 = pbVar14;
                    } while (iVar25 < 0x11);
                  }
                  uVar19 = uVar11 >> 7;
                  a->code_buffer = uVar19;
                  uVar9 = uVar9 - 7;
                  a->num_bits = uVar9;
                  uVar12 = (uVar11 & 0x7f) + 0xb;
                  goto LAB_0014327e;
                }
                if ((int)uVar9 < 2) {
                  pbVar13 = a->zbuffer;
                  do {
                    uVar9 = 0;
                    pbVar14 = pbVar13;
                    if (pbVar13 < a->zbuffer_end) {
                      pbVar14 = pbVar13 + 1;
                      a->zbuffer = pbVar14;
                      uVar9 = (uint)*pbVar13;
                    }
                    iVar25 = (int)unaff_R15;
                    uVar11 = uVar11 | uVar9 << ((byte)unaff_R15 & 0x1f);
                    a->code_buffer = uVar11;
                    uVar9 = iVar25 + 8;
                    a->num_bits = uVar9;
                    unaff_R15 = (ulong)uVar9;
                    pbVar13 = pbVar14;
                  } while (iVar25 < 0x11);
                }
                uVar19 = uVar11 >> 2;
                a->code_buffer = uVar19;
                unaff_R15 = (ulong)(uVar9 - 2);
                a->num_bits = uVar9 - 2;
                if (iVar10 == 0) {
                  *(char **)(in_FS_OFFSET + -0x10) = "bad codelengths";
                  iVar10 = 0;
                  bVar3 = false;
                  uVar11 = uVar19;
                  goto LAB_001432c1;
                }
                uVar12 = (uVar11 & 3) + 3;
                bVar6 = abStack_9e9[iVar10];
              }
              bVar3 = (int)uVar12 <= iVar23 - iVar10;
              uVar11 = uVar19;
              if (bVar3) {
                memset(abStack_9e9 + (long)iVar10 + 1,(uint)bVar6,(ulong)uVar12);
                iVar10 = iVar10 + uVar12;
              }
              else {
                *(char **)(in_FS_OFFSET + -0x10) = "bad codelengths";
              }
            }
          }
          else {
            *(char **)(in_FS_OFFSET + -0x10) = "bad codelengths";
            bVar3 = false;
          }
LAB_001432c1:
          uVar9 = (uint)unaff_R15;
          if (!bVar3) goto switchD_00142d74_caseD_3;
        }
        if (iVar23 != iVar10) {
          pcVar5 = "bad codelengths";
          goto LAB_00143822;
        }
        iVar10 = stbi__zbuild_huffman(&a->z_length,(stbi_uc *)((long)abStack_9e9 + 1),iVar4);
        if (iVar10 == 0) goto switchD_00142d74_caseD_3;
        iVar10 = stbi__zbuild_huffman(&a->z_distance,asStack_8e7 + uVar8,uVar24);
        break;
      case 3:
        goto switchD_00142d74_caseD_3;
      }
      if (iVar10 == 0) goto switchD_00142d74_caseD_3;
      pcVar5 = a->zout;
      do {
        if (a->num_bits < 0x10) {
          uVar8 = a->code_buffer;
          pbVar13 = a->zbuffer;
          iVar10 = a->num_bits;
          do {
            uVar9 = 0;
            pbVar14 = pbVar13;
            if (pbVar13 < a->zbuffer_end) {
              pbVar14 = pbVar13 + 1;
              a->zbuffer = pbVar14;
              uVar9 = (uint)*pbVar13;
            }
            uVar8 = uVar8 | uVar9 << ((byte)iVar10 & 0x1f);
            a->code_buffer = uVar8;
            a->num_bits = iVar10 + 8;
            bVar3 = iVar10 < 0x11;
            pbVar13 = pbVar14;
            iVar10 = iVar10 + 8;
          } while (bVar3);
        }
        uVar8 = a->code_buffer;
        uVar7 = (a->z_length).fast[uVar8 & 0x1ff];
        if (uVar7 == 0) {
          uVar7 = (ushort)uVar8 << 8 | (ushort)uVar8 >> 8;
          uVar9 = (uVar7 & 0xf0f) << 4 | (uVar7 & 0xf0f0) >> 4;
          uVar9 = (uVar9 >> 2 & 0x3333) + (uVar9 & 0x3333) * 4;
          uVar9 = (uVar9 >> 1 & 0x5555) + (uVar9 & 0x5555) * 2;
          lVar20 = 0;
          do {
            lVar15 = lVar20;
            lVar20 = lVar15 + 1;
          } while ((a->z_length).maxcode[lVar15 + 10] <= (int)uVar9);
          uVar11 = 0xffffffff;
          if (lVar20 != 7) {
            uVar7 = (a->z_length).firstcode[lVar15 + 10];
            uVar1 = (a->z_length).firstsymbol[lVar15 + 10];
            a->code_buffer = uVar8 >> ((char)lVar15 + 10U & 0x1f);
            a->num_bits = (a->num_bits - (int)lVar20) + -9;
            uVar11 = (uint)*(ushort *)
                            ((long)a +
                            ((ulong)uVar1 +
                            ((ulong)(uVar9 >> (7U - (char)lVar20 & 0x1f)) - (ulong)uVar7)) * 2 +
                            0x5d8);
          }
        }
        else {
          a->code_buffer = uVar8 >> ((byte)(uVar7 >> 9) & 0x1f);
          a->num_bits = a->num_bits - (uint)(uVar7 >> 9);
          uVar11 = uVar7 & 0x1ff;
        }
        if ((int)uVar11 < 0x100) {
          if ((int)uVar11 < 0) {
LAB_001436a1:
            *(char **)(in_FS_OFFSET + -0x10) = "bad huffman code";
LAB_001436b1:
            bVar3 = false;
            unaff_R15 = 0;
          }
          else {
            if (a->zout_end <= pcVar5) {
              iVar10 = stbi__zexpand(a,pcVar5,1);
              if (iVar10 == 0) goto LAB_001436b1;
              pcVar5 = a->zout;
            }
            *pcVar5 = (char)uVar11;
            pcVar5 = pcVar5 + 1;
            bVar3 = true;
          }
        }
        else if (uVar11 == 0x100) {
          a->zout = pcVar5;
          unaff_R15 = 1;
          bVar3 = false;
        }
        else {
          uVar21 = (ulong)(uVar11 - 0x101);
          uVar8 = stbi__zlength_base[uVar21];
          if (0xffffffffffffffeb < uVar21 - 0x1c) {
            iVar10 = stbi__zlength_extra[uVar21];
            if (a->num_bits < iVar10) {
              uVar9 = a->code_buffer;
              pbVar13 = a->zbuffer;
              iVar4 = a->num_bits;
              do {
                uVar11 = 0;
                pbVar14 = pbVar13;
                if (pbVar13 < a->zbuffer_end) {
                  pbVar14 = pbVar13 + 1;
                  a->zbuffer = pbVar14;
                  uVar11 = (uint)*pbVar13;
                }
                uVar9 = uVar9 | uVar11 << ((byte)iVar4 & 0x1f);
                a->code_buffer = uVar9;
                a->num_bits = iVar4 + 8;
                bVar3 = iVar4 < 0x11;
                pbVar13 = pbVar14;
                iVar4 = iVar4 + 8;
              } while (bVar3);
            }
            uVar9 = a->code_buffer;
            a->code_buffer = uVar9 >> ((byte)iVar10 & 0x1f);
            a->num_bits = a->num_bits - iVar10;
            uVar8 = uVar8 + (~(-1 << ((byte)iVar10 & 0x1f)) & uVar9);
          }
          if (a->num_bits < 0x10) {
            uVar9 = a->code_buffer;
            pbVar13 = a->zbuffer;
            iVar10 = a->num_bits;
            do {
              uVar11 = 0;
              pbVar14 = pbVar13;
              if (pbVar13 < a->zbuffer_end) {
                pbVar14 = pbVar13 + 1;
                a->zbuffer = pbVar14;
                uVar11 = (uint)*pbVar13;
              }
              uVar9 = uVar9 | uVar11 << ((byte)iVar10 & 0x1f);
              a->code_buffer = uVar9;
              a->num_bits = iVar10 + 8;
              bVar3 = iVar10 < 0x11;
              pbVar13 = pbVar14;
              iVar10 = iVar10 + 8;
            } while (bVar3);
          }
          uVar9 = a->code_buffer;
          uVar7 = (a->z_distance).fast[uVar9 & 0x1ff];
          if (uVar7 == 0) {
            uVar7 = (ushort)uVar9 << 8 | (ushort)uVar9 >> 8;
            uVar11 = (uVar7 & 0xf0f) << 4 | (uVar7 & 0xf0f0) >> 4;
            uVar11 = (uVar11 >> 2 & 0x3333) + (uVar11 & 0x3333) * 4;
            uVar11 = (uVar11 >> 1 & 0x5555) + (uVar11 & 0x5555) * 2;
            lVar20 = 0;
            do {
              lVar15 = lVar20;
              lVar20 = lVar15 + 1;
            } while ((a->z_distance).maxcode[lVar15 + 10] <= (int)uVar11);
            uVar21 = 0xffffffff;
            if (lVar20 != 7) {
              uVar7 = (a->z_distance).firstcode[lVar15 + 10];
              uVar1 = (a->z_distance).firstsymbol[lVar15 + 10];
              a->code_buffer = uVar9 >> ((char)lVar15 + 10U & 0x1f);
              a->num_bits = (a->num_bits - (int)lVar20) + -9;
              uVar21 = (ulong)*(ushort *)
                               ((long)a +
                               ((ulong)uVar1 +
                               ((ulong)(uVar11 >> (7U - (char)lVar20 & 0x1f)) - (ulong)uVar7)) * 2 +
                               0xdbc);
            }
          }
          else {
            a->code_buffer = uVar9 >> ((byte)(uVar7 >> 9) & 0x1f);
            a->num_bits = a->num_bits - (uint)(uVar7 >> 9);
            uVar21 = (ulong)(uVar7 & 0x1ff);
          }
          if ((int)uVar21 < 0) goto LAB_001436a1;
          iVar10 = stbi__zdist_base[uVar21];
          if (0xffffffffffffffe5 < uVar21 - 0x1e) {
            iVar4 = stbi__zdist_extra[uVar21];
            if (a->num_bits < iVar4) {
              sVar22 = a->code_buffer;
              pbVar13 = a->zbuffer;
              iVar23 = a->num_bits;
              do {
                uVar9 = 0;
                pbVar14 = pbVar13;
                if (pbVar13 < a->zbuffer_end) {
                  pbVar14 = pbVar13 + 1;
                  a->zbuffer = pbVar14;
                  uVar9 = (uint)*pbVar13;
                }
                sVar22 = sVar22 | uVar9 << ((byte)iVar23 & 0x1f);
                a->code_buffer = sVar22;
                a->num_bits = iVar23 + 8;
                bVar3 = iVar23 < 0x11;
                pbVar13 = pbVar14;
                iVar23 = iVar23 + 8;
              } while (bVar3);
            }
            uVar9 = a->code_buffer;
            a->code_buffer = uVar9 >> ((byte)iVar4 & 0x1f);
            a->num_bits = a->num_bits - iVar4;
            iVar10 = iVar10 + (~(-1 << ((byte)iVar4 & 0x1f)) & uVar9);
          }
          if ((long)pcVar5 - (long)a->zout_start < (long)iVar10) {
            *(char **)(in_FS_OFFSET + -0x10) = "bad dist";
LAB_00143694:
            bVar3 = false;
            unaff_R15 = 0;
          }
          else {
            if (a->zout_end < pcVar5 + (int)uVar8) {
              iVar4 = stbi__zexpand(a,pcVar5,uVar8);
              if (iVar4 == 0) goto LAB_00143694;
              pcVar5 = a->zout;
            }
            lVar20 = -(long)iVar10;
            bVar3 = true;
            if (iVar10 == 1) {
              if (uVar8 != 0) {
                memset(pcVar5,(uint)(byte)pcVar5[lVar20],(ulong)uVar8);
                pcVar5 = pcVar5 + (ulong)(uVar8 - 1) + 1;
              }
            }
            else {
              for (; uVar8 != 0; uVar8 = uVar8 - 1) {
                *pcVar5 = pcVar5[lVar20];
                pcVar5 = pcVar5 + 1;
              }
            }
          }
        }
      } while (bVar3);
      if ((int)unaff_R15 == 0) {
        return 0;
      }
LAB_001437e5:
    } while ((uVar18 & 1) == 0);
    iVar10 = 1;
  }
  else {
    pbVar13 = a->zbuffer;
    uVar8 = 0;
    uVar18 = 0;
    if (pbVar13 < a->zbuffer_end) {
      a->zbuffer = pbVar13 + 1;
      uVar18 = (uint)*pbVar13;
    }
    pbVar13 = a->zbuffer;
    if (pbVar13 < a->zbuffer_end) {
      a->zbuffer = pbVar13 + 1;
      uVar8 = (uint)*pbVar13;
    }
    if ((uVar18 << 8 | uVar8) * -0x42108421 < 0x8421085) {
      if ((uVar8 & 0x20) == 0) {
        if ((uVar18 & 0xf) == 8) goto LAB_00142ca9;
        pcVar5 = "bad compression";
      }
      else {
        pcVar5 = "no preset dict";
      }
    }
    else {
      pcVar5 = "bad zlib header";
    }
LAB_00143822:
    *(char **)(in_FS_OFFSET + -0x10) = pcVar5;
switchD_00142d74_caseD_3:
    iVar10 = 0;
  }
  return iVar10;
}

Assistant:

static int stbi__do_zlib(stbi__zbuf *a, char *obuf, int olen, int exp, int parse_header)
{
   a->zout_start = obuf;
   a->zout       = obuf;
   a->zout_end   = obuf + olen;
   a->z_expandable = exp;

   return stbi__parse_zlib(a, parse_header);
}